

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_cpp_difference_64(void **param_1)

{
  bool bVar1;
  pair<doublechecked::Roaring64Map,_doublechecked::Roaring64Map> two_maps;
  pair<doublechecked::Roaring64Map,_doublechecked::Roaring64Map> pStack_d8;
  
  make_two_big_roaring64_maps();
  doublechecked::Roaring64Map::operator-=(&pStack_d8.first,&pStack_d8.second);
  bVar1 = doublechecked::Roaring64Map::does_std_set_match_roaring(&pStack_d8.first);
  _assert_true((ulong)bVar1,"lhs.does_std_set_match_roaring()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x4ed);
  std::pair<doublechecked::Roaring64Map,_doublechecked::Roaring64Map>::~pair(&pStack_d8);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_difference_64) {
    auto two_maps = make_two_big_roaring64_maps();

    auto &lhs = two_maps.first;
    const auto &rhs = two_maps.second;

    lhs -= rhs;
    assert_true(lhs.does_std_set_match_roaring());
}